

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int Curl_protocol_getsock(connectdata *conn,curl_socket_t *socks,int numsocks)

{
  int numsocks_local;
  curl_socket_t *socks_local;
  connectdata *conn_local;
  
  if (conn->handler->proto_getsock == (_func_int_connectdata_ptr_curl_socket_t_ptr_int *)0x0) {
    *socks = conn->sock[0];
    conn_local._4_4_ = 0x10001;
  }
  else {
    conn_local._4_4_ = (*conn->handler->proto_getsock)(conn,socks,numsocks);
  }
  return conn_local._4_4_;
}

Assistant:

int Curl_protocol_getsock(struct connectdata *conn,
                          curl_socket_t *socks,
                          int numsocks)
{
  if(conn->handler->proto_getsock)
    return conn->handler->proto_getsock(conn, socks, numsocks);
  /* Backup getsock logic. Since there is a live socket in use, we must wait
     for it or it will be removed from watching when the multi_socket API is
     used. */
  socks[0] = conn->sock[FIRSTSOCKET];
  return GETSOCK_READSOCK(0) | GETSOCK_WRITESOCK(0);
}